

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_string.c
# Opt level: O1

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/deps/cJSON/tests/print_string.c"
            );
  UnityDefaultTestRun(print_string_should_print_empty_strings,
                      "print_string_should_print_empty_strings",0x49);
  UnityDefaultTestRun(print_string_should_print_ascii,"print_string_should_print_ascii",0x4a);
  UnityDefaultTestRun(print_string_should_print_utf8,"print_string_should_print_utf8",0x4b);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    /* initialize cJSON item */
    UNITY_BEGIN();

    RUN_TEST(print_string_should_print_empty_strings);
    RUN_TEST(print_string_should_print_ascii);
    RUN_TEST(print_string_should_print_utf8);

    return UNITY_END();
}